

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack12(uint32_t *out,uint32_t *in,uint32_t bs)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (0x1f < bs + 0x1f) {
    uVar6 = bs + 0x1f >> 5;
    auVar2 = vpmovsxbd_avx(ZEXT416(0x804101c));
    auVar4 = vpmovsxwd_avx(ZEXT816(0xf000fff0fff0000));
    auVar10._8_8_ = 0xff000000fff;
    auVar10._0_8_ = 0xff000000fff;
    auVar5 = vpmovsxwd_avx(ZEXT816(0xff00fff00140fff));
    auVar3 = vpmovsxbd_avx(ZEXT416(0x3020107));
    do {
      uVar7 = *in;
      *out = uVar7 >> 0x14;
      out[1] = uVar7 >> 8 & 0xfff;
      uVar8 = (uVar7 & 0xff) << 4;
      out[2] = uVar8;
      uVar7 = in[1];
      auVar9._4_4_ = uVar7;
      auVar9._0_4_ = uVar7;
      auVar9._8_4_ = uVar7;
      auVar9._12_4_ = uVar7;
      auVar11 = vpsrlvd_avx2(auVar9,auVar2);
      auVar9 = vpsllvd_avx2(auVar9,auVar2);
      auVar12 = vpblendd_avx2(auVar11,auVar9,8);
      auVar9 = vpinsrd_avx(auVar4,uVar8,0);
      auVar11 = vpor_avx(auVar11,auVar9);
      auVar9 = vpand_avx(auVar12,auVar9);
      auVar11 = vpblendd_avx2(auVar9,auVar11,1);
      *(undefined1 (*) [16])(out + 2) = auVar11;
      uVar1 = *(ulong *)(in + 2);
      out[5] = (uint)(uVar1 >> 0x18) & 0xff | auVar9._12_4_;
      out[6] = (uint)uVar1 >> 0xc & 0xfff;
      uVar7 = (uint)(uVar1 >> 0x20);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar1;
      auVar9 = vpinsrd_avx(auVar11,uVar7 >> 8,2);
      auVar9 = vpinsrd_avx(auVar9,uVar7 << 4,3);
      auVar9 = vpand_avx(auVar9,auVar10);
      auVar11 = vpsrlvd_avx2(auVar11,auVar5);
      auVar11 = vpblendd_avx2(auVar9,auVar11,2);
      *(undefined1 (*) [16])(out + 7) = auVar11;
      uVar7 = in[4];
      auVar12._4_4_ = uVar7;
      auVar12._0_4_ = uVar7;
      auVar12._8_4_ = uVar7;
      auVar12._12_4_ = uVar7;
      auVar13 = vpsrlvd_avx2(auVar12,auVar2);
      auVar11 = vpsllvd_avx2(auVar12,auVar2);
      auVar12 = vpblendd_avx2(auVar13,auVar11,8);
      auVar9 = vpermt2d_avx512vl(auVar4,auVar3,auVar9);
      auVar11 = vpor_avx(auVar9,auVar13);
      auVar9 = vpand_avx(auVar9,auVar12);
      auVar11 = vpblendd_avx2(auVar9,auVar11,1);
      *(undefined1 (*) [16])(out + 10) = auVar11;
      uVar1 = *(ulong *)(in + 5);
      out[0xd] = (uint)(uVar1 >> 0x18) & 0xff | auVar9._12_4_;
      out[0xe] = (uint)uVar1 >> 0xc & 0xfff;
      uVar7 = (uint)(uVar1 >> 0x20);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar1;
      auVar9 = vpinsrd_avx(auVar13,uVar7 >> 8,2);
      auVar9 = vpinsrd_avx(auVar9,uVar7 << 4,3);
      auVar9 = vpand_avx(auVar9,auVar10);
      auVar11 = vpsrlvd_avx2(auVar13,auVar5);
      auVar11 = vpblendd_avx2(auVar9,auVar11,2);
      *(undefined1 (*) [16])(out + 0xf) = auVar11;
      uVar7 = in[7];
      auVar14._4_4_ = uVar7;
      auVar14._0_4_ = uVar7;
      auVar14._8_4_ = uVar7;
      auVar14._12_4_ = uVar7;
      auVar13 = vpsrlvd_avx2(auVar14,auVar2);
      auVar11 = vpsllvd_avx2(auVar14,auVar2);
      auVar12 = vpblendd_avx2(auVar13,auVar11,8);
      auVar9 = vpermt2d_avx512vl(auVar4,auVar3,auVar9);
      auVar11 = vpor_avx(auVar9,auVar13);
      auVar9 = vpand_avx(auVar9,auVar12);
      auVar11 = vpblendd_avx2(auVar9,auVar11,1);
      *(undefined1 (*) [16])(out + 0x12) = auVar11;
      uVar1 = *(ulong *)(in + 8);
      out[0x15] = (uint)(uVar1 >> 0x18) & 0xff | auVar9._12_4_;
      out[0x16] = (uint)uVar1 >> 0xc & 0xfff;
      uVar7 = (uint)(uVar1 >> 0x20);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar1;
      auVar9 = vpinsrd_avx(auVar15,uVar7 >> 8,2);
      auVar9 = vpinsrd_avx(auVar9,uVar7 << 4,3);
      auVar9 = vpand_avx(auVar9,auVar10);
      auVar11 = vpsrlvd_avx2(auVar15,auVar5);
      auVar11 = vpblendd_avx2(auVar9,auVar11,2);
      *(undefined1 (*) [16])(out + 0x17) = auVar11;
      uVar7 = in[10];
      auVar16._4_4_ = uVar7;
      auVar16._0_4_ = uVar7;
      auVar16._8_4_ = uVar7;
      auVar16._12_4_ = uVar7;
      auVar13 = vpsrlvd_avx2(auVar16,auVar2);
      auVar11 = vpsllvd_avx2(auVar16,auVar2);
      auVar12 = vpblendd_avx2(auVar13,auVar11,8);
      auVar9 = vpermt2d_avx512vl(auVar4,auVar3,auVar9);
      auVar11 = vpor_avx(auVar9,auVar13);
      auVar9 = vpand_avx(auVar9,auVar12);
      auVar11 = vpblendd_avx2(auVar9,auVar11,1);
      *(undefined1 (*) [16])(out + 0x1a) = auVar11;
      uVar7 = in[0xb];
      out[0x1d] = auVar9._12_4_ | uVar7 >> 0x18;
      out[0x1e] = uVar7 >> 0xc & 0xfff;
      out[0x1f] = uVar7 & 0xfff;
      out = out + 0x20;
      in = in + 0xc;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack12(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 12, --bs) {
    out[0] = in[0] >> 20;
    out[1] = (in[0] >> 8) & 0x0fff;
    out[2] = (in[0] << 4) & 0x0fff;
    out[2] |= in[1] >> 28;
    out[3] = (in[1] >> 16) & 0x0fff;
    out[4] = (in[1] >> 4) & 0x0fff;
    out[5] = (in[1] << 8) & 0x0fff;
    out[5] |= in[2] >> 24;
    out[6] = (in[2] >> 12) & 0x0fff;
    out[7] = in[2] & 0x0fff;
    out[8] = in[3] >> 20;
    out[9] = (in[3] >> 8) & 0x0fff;
    out[10] = (in[3] << 4) & 0x0fff;
    out[10] |= in[4] >> 28;
    out[11] = (in[4] >> 16) & 0x0fff;
    out[12] = (in[4] >> 4) & 0x0fff;
    out[13] = (in[4] << 8) & 0x0fff;
    out[13] |= in[5] >> 24;
    out[14] = (in[5] >> 12) & 0x0fff;
    out[15] = in[5] & 0x0fff;
    out[16] = in[6] >> 20;
    out[17] = (in[6] >> 8) & 0x0fff;
    out[18] = (in[6] << 4) & 0x0fff;
    out[18] |= in[7] >> 28;
    out[19] = (in[7] >> 16) & 0x0fff;
    out[20] = (in[7] >> 4) & 0x0fff;
    out[21] = (in[7] << 8) & 0x0fff;
    out[21] |= in[8] >> 24;
    out[22] = (in[8] >> 12) & 0x0fff;
    out[23] = in[8] & 0x0fff;
    out[24] = in[9] >> 20;
    out[25] = (in[9] >> 8) & 0x0fff;
    out[26] = (in[9] << 4) & 0x0fff;
    out[26] |= in[10] >> 28;
    out[27] = (in[10] >> 16) & 0x0fff;
    out[28] = (in[10] >> 4) & 0x0fff;
    out[29] = (in[10] << 8) & 0x0fff;
    out[29] |= in[11] >> 24;
    out[30] = (in[11] >> 12) & 0x0fff;
    out[31] = in[11] & 0x0fff;
  }
}